

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_database.cpp
# Opt level: O0

Mesh * MeshDb::create_mesh(Mesh *__return_storage_ptr__,
                          vector<Vertex,_std::allocator<Vertex>_> *p_vertices,
                          vector<unsigned_int,_std::allocator<unsigned_int>_> *p_indices,
                          vector<Texture,_std::allocator<Texture>_> *p_textures)

{
  PFNGLBUFFERDATAPROC p_Var1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  pair<unsigned_long,_Mesh> local_a0;
  undefined1 local_3d;
  GLuint local_3c;
  GLuint local_38;
  GLuint mesh_ebo_gl_id;
  GLuint mesh_vbo_gl_id;
  GLuint mesh_vao_gl_id;
  size_t mesh_id;
  vector<Texture,_std::allocator<Texture>_> *p_textures_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *p_indices_local;
  vector<Vertex,_std::allocator<Vertex>_> *p_vertices_local;
  Mesh *mesh;
  
  mesh_id = (size_t)p_textures;
  p_textures_local = (vector<Texture,_std::allocator<Texture>_> *)p_indices;
  p_indices_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_vertices;
  p_vertices_local = (vector<Vertex,_std::allocator<Vertex>_> *)__return_storage_ptr__;
  _mesh_vbo_gl_id =
       std::__atomic_base<unsigned_long>::operator++
                 (&create_mesh::mesh_id_counter.super___atomic_base<unsigned_long>,0);
  mesh_ebo_gl_id = 0;
  local_38 = 0;
  local_3c = 0;
  (*glad_glGenVertexArrays)(1,&mesh_ebo_gl_id);
  (*glad_glGenBuffers)(1,&local_38);
  (*glad_glGenBuffers)(1,&local_3c);
  (*glad_glBindVertexArray)(mesh_ebo_gl_id);
  (*glad_glBindBuffer)(0x8892,local_38);
  p_Var1 = glad_glBufferData;
  sVar2 = std::vector<Vertex,_std::allocator<Vertex>_>::size
                    ((vector<Vertex,_std::allocator<Vertex>_> *)p_indices_local);
  pvVar3 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                     ((vector<Vertex,_std::allocator<Vertex>_> *)p_indices_local,0);
  (*p_Var1)(0x8892,sVar2 * 0x38,pvVar3,0x88e4);
  (*glad_glBindBuffer)(0x8893,local_3c);
  p_Var1 = glad_glBufferData;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_textures_local);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_textures_local,0);
  (*p_Var1)(0x8893,sVar2 << 2,pvVar4,0x88e4);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0x38,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(1);
  (*glad_glVertexAttribPointer)(1,3,0x1406,'\0',0x38,(void *)0xc);
  (*glad_glEnableVertexAttribArray)(2);
  (*glad_glVertexAttribPointer)(2,2,0x1406,'\0',0x38,(void *)0x30);
  (*glad_glEnableVertexAttribArray)(3);
  (*glad_glVertexAttribPointer)(3,3,0x1406,'\0',0x38,(void *)0x18);
  (*glad_glEnableVertexAttribArray)(4);
  (*glad_glVertexAttribPointer)(4,3,0x1406,'\0',0x38,(void *)0x24);
  (*glad_glBindVertexArray)(0);
  local_3d = 0;
  ::Mesh::Mesh(__return_storage_ptr__,mesh_ebo_gl_id,local_38,local_3c,
               (vector<Vertex,_std::allocator<Vertex>_> *)p_indices_local,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_textures_local,
               (vector<Texture,_std::allocator<Texture>_> *)mesh_id);
  std::make_pair<unsigned_long_const&,Mesh&>
            (&local_a0,(unsigned_long *)&mesh_vbo_gl_id,__return_storage_ptr__);
  std::
  unordered_map<unsigned_long,Mesh,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Mesh>>>
  ::emplace<std::pair<unsigned_long,Mesh>>
            ((unordered_map<unsigned_long,Mesh,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Mesh>>>
              *)map,&local_a0);
  std::pair<unsigned_long,_Mesh>::~pair(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Mesh MeshDb::create_mesh(
    const std::vector<Vertex> &p_vertices,
    const std::vector<unsigned int> &p_indices,
    const std::vector<Texture> &p_textures) noexcept
{
    static std::atomic<std::size_t> mesh_id_counter = 1;
    const std::size_t mesh_id = mesh_id_counter++;
    GLuint mesh_vao_gl_id = 0;
    GLuint mesh_vbo_gl_id = 0;
    GLuint mesh_ebo_gl_id = 0;

    glGenVertexArrays(1, &mesh_vao_gl_id);
    glGenBuffers(1, &mesh_vbo_gl_id);
    glGenBuffers(1, &mesh_ebo_gl_id);

    glBindVertexArray(mesh_vao_gl_id);
    glBindBuffer(GL_ARRAY_BUFFER, mesh_vbo_gl_id);

    glBufferData(
        GL_ARRAY_BUFFER,
        p_vertices.size() * sizeof(Vertex),
        &p_vertices[0],
        GL_STATIC_DRAW);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, mesh_ebo_gl_id);
    glBufferData(
        GL_ELEMENT_ARRAY_BUFFER,
        p_indices.size() * sizeof(unsigned int),
        &p_indices[0],
        GL_STATIC_DRAW);

    // vertex positions
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)0);

    // vertex normals
    glEnableVertexAttribArray(1);
    glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, m_normal));

    // vertex texture coords
    glEnableVertexAttribArray(2);
    glVertexAttribPointer(2, 2, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, m_tex_coord));

    // vertex tangent
    glEnableVertexAttribArray(3);
    glVertexAttribPointer(3, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, m_tangent));

    // vertex bitangent
    glEnableVertexAttribArray(4);
    glVertexAttribPointer(4, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, m_bitangent));

    glBindVertexArray(0);

    Mesh mesh = Mesh(
        mesh_vao_gl_id,
        mesh_vbo_gl_id,
        mesh_ebo_gl_id,
        p_vertices,
        p_indices,
        p_textures);
    map.emplace(
        std::make_pair(
            mesh_id,
            mesh));
    return mesh;
}